

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool __thiscall SQGenerator::Yield(SQGenerator *this,SQVM *v,SQInteger target)

{
  SQObjectType type;
  ulong uVar1;
  SQObjectPtr *pSVar2;
  SQWeakRef *x;
  SQExceptionTrap *pSVar3;
  SQUnsignedInteger newsize;
  bool bVar4;
  SQExceptionTrap *et;
  SQInteger i;
  SQInteger j;
  SQInteger n;
  SQObjectPtr local_80;
  SQObject local_70;
  ulong local_60;
  SQObject _this;
  SQObjectPtr local_40;
  SQUnsignedInteger local_30;
  SQInteger size;
  SQInteger target_local;
  SQVM *v_local;
  SQGenerator *this_local;
  
  size = target;
  target_local = (SQInteger)v;
  v_local = (SQVM *)this;
  if (this->_state == eSuspended) {
    SQVM::Raise_Error(v,"internal vm error, yielding dead generator");
    this_local._7_1_ = false;
  }
  else if (this->_state == eDead) {
    SQVM::Raise_Error(v,"internal vm error, yielding a dead generator");
    this_local._7_1_ = false;
  }
  else {
    newsize = v->_top - v->_stackbase;
    local_30 = newsize;
    ::SQObjectPtr::SQObjectPtr(&local_40);
    sqvector<SQObjectPtr>::resize(&this->_stack,newsize,&local_40);
    ::SQObjectPtr::~SQObjectPtr(&local_40);
    pSVar2 = sqvector<SQObjectPtr>::operator[]
                       ((sqvector<SQObjectPtr> *)(target_local + 0x30),
                        *(SQUnsignedInteger *)(target_local + 0x50));
    local_70._0_8_ = *(undefined8 *)&pSVar2->super_SQObject;
    local_70._unVal = (SQObjectValue)(pSVar2->super_SQObject)._unVal.pRefCounted;
    local_60._0_4_ = (SQObjectType)local_70._0_8_;
    bVar4 = (local_70._0_8_ & 0x8000000) != 0;
    uVar1 = local_70._0_8_;
    _this._0_8_ = local_70._unVal;
    if (bVar4) {
      type = (SQObjectType)local_60;
      local_60 = local_70._0_8_;
      x = SQRefCounted::GetWeakRef(local_70._unVal.pRefCounted,type);
      ::SQObjectPtr::SQObjectPtr(&local_80,x);
      local_70._type = local_80.super_SQObject._type;
      local_70._4_4_ = local_80.super_SQObject._4_4_;
      local_70._unVal = local_80.super_SQObject._unVal;
      uVar1 = local_60;
    }
    local_60 = uVar1;
    ::SQObjectPtr::operator=((this->_stack)._vals,&local_70);
    if (bVar4) {
      ::SQObjectPtr::~SQObjectPtr(&local_80);
    }
    for (j = 1; j < size; j = j + 1) {
      pSVar2 = sqvector<SQObjectPtr>::operator[]
                         ((sqvector<SQObjectPtr> *)(target_local + 0x30),
                          *(long *)(target_local + 0x50) + j);
      ::SQObjectPtr::operator=((this->_stack)._vals + j,pSVar2);
    }
    for (i = 0; i < (long)local_30; i = i + 1) {
      pSVar2 = sqvector<SQObjectPtr>::operator[]
                         ((sqvector<SQObjectPtr> *)(target_local + 0x30),
                          *(long *)(target_local + 0x50) + i);
      ::SQObjectPtr::Null(pSVar2);
    }
    SQVM::CallInfo::operator=(&this->_ci,*(CallInfo **)(target_local + 0x108));
    (this->_ci)._generator = (SQGenerator *)0x0;
    for (et = (SQExceptionTrap *)0x0; (long)et < (long)(this->_ci)._etraps;
        et = (SQExceptionTrap *)((long)&et->_stackbase + 1)) {
      pSVar3 = sqvector<SQExceptionTrap>::top((sqvector<SQExceptionTrap> *)(target_local + 0xf0));
      sqvector<SQExceptionTrap>::push_back(&this->_etraps,pSVar3);
      sqvector<SQExceptionTrap>::pop_back((sqvector<SQExceptionTrap> *)(target_local + 0xf0));
      pSVar3 = sqvector<SQExceptionTrap>::back(&this->_etraps);
      pSVar3->_stackbase = pSVar3->_stackbase - *(long *)(target_local + 0x50);
      pSVar3->_stacksize = pSVar3->_stacksize - *(long *)(target_local + 0x50);
    }
    this->_state = eSuspended;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SQGenerator::Yield(SQVM *v,SQInteger target)
{
    if(_state==eSuspended) { v->Raise_Error(_SC("internal vm error, yielding dead generator"));  return false;}
    if(_state==eDead) { v->Raise_Error(_SC("internal vm error, yielding a dead generator")); return false; }
    SQInteger size = v->_top-v->_stackbase;

    _stack.resize(size);
    SQObject _this = v->_stack[v->_stackbase];
    _stack._vals[0] = ISREFCOUNTED(type(_this)) ? SQObjectPtr(_refcounted(_this)->GetWeakRef(type(_this))) : _this;
    for(SQInteger n =1; n<target; n++) {
        _stack._vals[n] = v->_stack[v->_stackbase+n];
    }
    for(SQInteger j =0; j < size; j++)
    {
        v->_stack[v->_stackbase+j].Null();
    }

    _ci = *v->ci;
    _ci._generator=NULL;
    for(SQInteger i=0;i<_ci._etraps;i++) {
        _etraps.push_back(v->_etraps.top());
        v->_etraps.pop_back();
        // store relative stack base and size in case of resume to other _top
        SQExceptionTrap &et = _etraps.back();
        et._stackbase -= v->_stackbase;
        et._stacksize -= v->_stackbase;
    }
    _state=eSuspended;
    return true;
}